

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O1

void __thiscall rw::Geometry::allocateData(Geometry *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Triangle *pTVar4;
  MorphTarget *pMVar5;
  V3d **ppVVar6;
  uint uVar7;
  long lVar8;
  TexCoords *pTVar9;
  ulong uVar10;
  long lVar11;
  MorphTarget *pMVar12;
  
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 384"
  ;
  pTVar4 = (Triangle *)
           (*DAT_00149de8)((long)((this->numVertices * 4 & (int)(this->flags << 0x1c) >> 0x1f) +
                                 (this->numVertices * this->numTexCoordSets + this->numTriangles) *
                                 8),0x3000f);
  this->triangles = pTVar4;
  lVar8 = (long)this->numTriangles;
  if (0 < lVar8) {
    lVar11 = 0;
    do {
      pTVar4[lVar11].matId = 0xffff;
      lVar11 = lVar11 + 1;
    } while (lVar8 != lVar11);
  }
  pTVar9 = (TexCoords *)(pTVar4 + lVar8);
  uVar1 = this->flags;
  if ((uVar1 & 8) != 0) {
    this->colors = (RGBA *)pTVar9;
    pTVar9 = (TexCoords *)(&pTVar9->u + this->numVertices);
  }
  iVar2 = this->numTexCoordSets;
  if (0 < (long)iVar2) {
    iVar3 = this->numVertices;
    lVar8 = 0;
    do {
      this->texCoords[lVar8] = pTVar9;
      pTVar9 = pTVar9 + iVar3;
      lVar8 = lVar8 + 1;
    } while (iVar2 != lVar8);
  }
  uVar7 = this->numVertices * 0xc;
  allocLocation =
       "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/geometry.cpp line: 405"
  ;
  pMVar5 = (MorphTarget *)
           (*DAT_00149df0)(this->morphTargets,
                           (long)(int)(((int)(uVar1 << 0x1b) >> 0x1f & uVar7) + uVar7 + 0x28) *
                           (long)this->numMorphTargets,0x3000f);
  this->morphTargets = pMVar5;
  uVar10 = (ulong)this->numMorphTargets;
  if (0 < (long)uVar10) {
    pMVar12 = pMVar5 + uVar10;
    iVar2 = this->numVertices;
    uVar1 = this->flags;
    ppVVar6 = &pMVar5->normals;
    do {
      ((MorphTarget *)(ppVVar6 + -4))->parent = this;
      ppVVar6[-1] = (V3d *)0x0;
      *ppVVar6 = (V3d *)0x0;
      if (iVar2 != 0) {
        ppVVar6[-1] = (V3d *)pMVar12;
        pMVar12 = (MorphTarget *)((long)&pMVar12->parent + (long)iVar2 * 0xc);
        if ((uVar1 & 0x10) != 0) {
          *ppVVar6 = (V3d *)pMVar12;
          pMVar12 = (MorphTarget *)((long)&pMVar12->parent + (long)iVar2 * 0xc);
        }
      }
      ppVVar6 = ppVVar6 + 5;
      uVar7 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar7;
    } while (uVar7 != 0);
  }
  return;
}

Assistant:

void
Geometry::allocateData(void)
{
	// Geometry data
	// Pretty much copy pasted from ::create above
	int32 sz = this->numTriangles*sizeof(Triangle);
	if(this->flags & PRELIT)
		sz += this->numVertices*sizeof(RGBA);
	sz += this->numTexCoordSets*this->numVertices*sizeof(TexCoords);

	uint8 *data = (uint8*)rwNew(sz, MEMDUR_EVENT | ID_GEOMETRY);
	this->triangles = (Triangle*)data;
	data += this->numTriangles*sizeof(Triangle);
	for(int32 i = 0; i < this->numTriangles; i++)
		this->triangles[i].matId = 0xFFFF;
	if(this->flags & PRELIT){
		this->colors = (RGBA*)data;
		data += this->numVertices*sizeof(RGBA);
	}
	for(int32 i = 0; i < this->numTexCoordSets; i++){
		this->texCoords[i] = (TexCoords*)data;
		data += this->numVertices*sizeof(TexCoords);
	}

	// MorphTarget data
	// Bounding sphere is copied by realloc.
	sz = sizeof(MorphTarget) + this->numVertices*sizeof(V3d);
	if(this->flags & NORMALS)
		sz += this->numVertices*sizeof(V3d);

	MorphTarget *mt = (MorphTarget*)rwResize(this->morphTargets,
		sz*this->numMorphTargets, MEMDUR_EVENT | ID_GEOMETRY);
	this->morphTargets = mt;
	V3d *vdata = (V3d*)&mt[this->numMorphTargets];
	for(int32 i = 0; i < this->numMorphTargets; i++){
		mt->parent = this;
		mt->vertices = nil;
		mt->normals = nil;
		if(this->numVertices){
			mt->vertices = vdata;
			vdata += this->numVertices;
			if(this->flags & NORMALS){
				mt->normals = vdata;
				vdata += this->numVertices;
			}
		}
		mt++;
	}
}